

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc.c
# Opt level: O1

void etdc_new_symbol(etdc_table **table,uint s)

{
  UT_hash_handle *pUVar1;
  UT_hash_bucket *pUVar2;
  uint *puVar3;
  etdc_table *peVar4;
  UT_hash_table *pUVar5;
  UT_hash_handle *pUVar6;
  UT_hash_bucket *pUVar7;
  UT_hash_handle *pUVar8;
  UT_hash_handle *pUVar9;
  uint uVar10;
  etdc_table *peVar11;
  UT_hash_table *pUVar12;
  UT_hash_bucket *pUVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  char *_hj_key;
  size_t __size;
  
  peVar11 = (etdc_table *)malloc(0x50);
  peVar11->symbol = s;
  peVar11->freq = 1;
  pUVar1 = &peVar11->hh;
  (peVar11->hh).next = (void *)0x0;
  (peVar11->hh).key = peVar11;
  (peVar11->hh).keylen = 4;
  if (*table == (etdc_table *)0x0) {
    *table = peVar11;
    (peVar11->hh).prev = (void *)0x0;
    pUVar12 = (UT_hash_table *)malloc(0x40);
    (peVar11->hh).tbl = pUVar12;
    if (pUVar12 == (UT_hash_table *)0x0) goto LAB_00101c29;
    *(undefined8 *)&pUVar12->num_items = 0;
    pUVar12->tail = (UT_hash_handle *)0x0;
    pUVar12->buckets = (UT_hash_bucket *)0x0;
    pUVar12->num_buckets = 0;
    pUVar12->log2_num_buckets = 0;
    pUVar12->hho = 0;
    pUVar12->ideal_chain_maxlen = 0;
    pUVar12->nonideal_items = 0;
    pUVar12->ineff_expands = 0;
    pUVar12->noexpand = 0;
    *(undefined8 *)&pUVar12->signature = 0;
    pUVar12->tail = pUVar1;
    pUVar12->num_buckets = 0x20;
    pUVar12->log2_num_buckets = 5;
    pUVar12->hho = 0x18;
    pUVar13 = (UT_hash_bucket *)malloc(0x200);
    pUVar12->buckets = pUVar13;
    if (pUVar13 == (UT_hash_bucket *)0x0) goto LAB_00101c29;
    memset(pUVar13,0,0x200);
    pUVar12->signature = 0xa0111fe1;
  }
  else {
    (((*table)->hh).tbl)->tail->next = peVar11;
    pUVar12 = ((*table)->hh).tbl;
    (peVar11->hh).prev = (void *)((long)pUVar12->tail - pUVar12->hho);
    pUVar12->tail = pUVar1;
  }
  peVar4 = *table;
  pUVar12 = (peVar4->hh).tbl;
  pUVar12->num_items = pUVar12->num_items + 1;
  (peVar11->hh).tbl = pUVar12;
  uVar15 = (int)(char)peVar11->symbol +
           *(char *)((long)&peVar11->symbol + 1) * 0x100 +
           *(char *)((long)&peVar11->symbol + 2) * 0x10000 +
           (uint)*(byte *)((long)&peVar11->symbol + 3) * 0x1000000 + 0x112410d ^ 0x7f76d;
  uVar14 = uVar15 << 8 ^ 0x9f49bac6 - uVar15;
  uVar17 = uVar14 >> 0xd ^ (-0x112410d - uVar15) - uVar14;
  uVar18 = uVar17 >> 0xc ^ (uVar15 - uVar14) - uVar17;
  uVar15 = uVar18 << 0x10 ^ (uVar14 - uVar17) - uVar18;
  uVar14 = uVar15 >> 5 ^ (uVar17 - uVar18) - uVar15;
  uVar17 = uVar14 >> 3 ^ (uVar18 - uVar15) - uVar14;
  uVar15 = uVar17 << 10 ^ (uVar15 - uVar14) - uVar17;
  uVar14 = uVar15 >> 0xf ^ uVar14 - (uVar17 + uVar15);
  (peVar11->hh).hashv = uVar14;
  pUVar5 = (peVar4->hh).tbl;
  uVar14 = pUVar5->num_buckets - 1 & uVar14;
  pUVar13 = pUVar5->buckets;
  puVar3 = &pUVar13[uVar14].count;
  *puVar3 = *puVar3 + 1;
  pUVar6 = pUVar13[uVar14].hh_head;
  (peVar11->hh).hh_next = pUVar6;
  (peVar11->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar6 != (UT_hash_handle *)0x0) {
    pUVar6->hh_prev = pUVar1;
  }
  (((*table)->hh).tbl)->buckets[uVar14].hh_head = pUVar1;
  pUVar13 = (((*table)->hh).tbl)->buckets;
  if ((pUVar13[uVar14].expand_mult * 10 + 10 <= pUVar13[uVar14].count) && (pUVar12->noexpand != 1))
  {
    __size = (ulong)(pUVar12->num_buckets * 2) << 4;
    pUVar13 = (UT_hash_bucket *)malloc(__size);
    if (pUVar13 == (UT_hash_bucket *)0x0) {
LAB_00101c29:
      exit(-1);
    }
    uVar15 = 0;
    memset(pUVar13,0,__size);
    uVar14 = pUVar12->num_buckets;
    uVar18 = uVar14 * 2 - 1;
    uVar17 = ((pUVar12->num_items >> ((char)pUVar12->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((uVar18 & pUVar12->num_items) == 0);
    pUVar12->ideal_chain_maxlen = uVar17;
    pUVar12->nonideal_items = 0;
    if ((ulong)uVar14 != 0) {
      pUVar7 = pUVar12->buckets;
      uVar19 = 0;
      do {
        pUVar6 = pUVar7[uVar19].hh_head;
        while (pUVar6 != (UT_hash_handle *)0x0) {
          pUVar8 = pUVar6->hh_next;
          uVar16 = pUVar6->hashv & uVar18;
          pUVar2 = pUVar13 + uVar16;
          uVar10 = pUVar13[uVar16].count + 1;
          pUVar13[uVar16].count = uVar10;
          if (uVar17 < uVar10) {
            pUVar12->nonideal_items = pUVar12->nonideal_items + 1;
            pUVar2->expand_mult = uVar10 / uVar17;
          }
          pUVar6->hh_prev = (UT_hash_handle *)0x0;
          pUVar9 = pUVar2->hh_head;
          pUVar6->hh_next = pUVar9;
          if (pUVar9 != (UT_hash_handle *)0x0) {
            pUVar9->hh_prev = pUVar6;
          }
          pUVar2->hh_head = pUVar6;
          pUVar6 = pUVar8;
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar14);
    }
    free(pUVar12->buckets);
    pUVar12 = pUVar1->tbl;
    pUVar12->num_buckets = pUVar12->num_buckets << 1;
    pUVar12->log2_num_buckets = pUVar12->log2_num_buckets + 1;
    pUVar12->buckets = pUVar13;
    if (pUVar12->num_items >> 1 < pUVar12->nonideal_items) {
      uVar15 = pUVar12->ineff_expands + 1;
    }
    pUVar12->ineff_expands = uVar15;
    if (1 < uVar15) {
      pUVar12->noexpand = 1;
    }
  }
  return;
}

Assistant:

void etdc_new_symbol( struct etdc_table **table, unsigned int s) {
  struct etdc_table *e;
  
  e = (struct etdc_table *)malloc(sizeof(struct etdc_table));
  e->symbol = s;
  e->freq = 1;

  //fprintf(stderr, "Adding new symbol to etdc table");
  HASH_ADD_INT(*table, symbol, e);
}